

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x25519.c
# Opt level: O2

int x25519_derive_secret
              (ptls_iovec_t *secret,uint8_t *clientpriv,uint8_t *clientpub,uint8_t *serverpriv,
              uint8_t *serverpub)

{
  int iVar1;
  uint8_t *q;
  
  q = (uint8_t *)malloc(0x20);
  secret->base = q;
  if (q == (uint8_t *)0x0) {
    iVar1 = 0x201;
  }
  else {
    if (clientpriv == (uint8_t *)0x0) {
      serverpub = clientpub;
      clientpriv = serverpriv;
    }
    cf_curve25519_mul(q,clientpriv,serverpub);
    secret->len = 0x20;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int x25519_derive_secret(ptls_iovec_t *secret, const uint8_t *clientpriv, const uint8_t *clientpub,
                                const uint8_t *serverpriv, const uint8_t *serverpub)
{
    if ((secret->base = malloc(X25519_KEY_SIZE)) == NULL)
        return PTLS_ERROR_NO_MEMORY;

    cf_curve25519_mul(secret->base, clientpriv != NULL ? clientpriv : serverpriv, clientpriv != NULL ? serverpub : clientpub);
    secret->len = X25519_KEY_SIZE;
    return 0;
}